

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O0

void __thiscall YdiskRestClient::makeFolder(YdiskRestClient *this,string *utf8Path)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  SSLClient *path;
  Headers *headers;
  element_type *peVar1;
  element_type *peVar2;
  undefined1 local_a0 [8];
  shared_ptr<httplib::Response> r;
  string empty_body;
  allocator local_39;
  string local_38 [8];
  string url;
  string *utf8Path_local;
  YdiskRestClient *this_local;
  
  url.field_2._8_8_ = utf8Path;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"/v1/disk/resources?path=",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  url_encode((string *)((long)&empty_body.field_2 + 8),this,utf8Path);
  std::__cxx11::string::operator+=(local_38,(string *)(empty_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(empty_body.field_2._M_local_buf + 8));
  this_00 = &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__cxx11::string::string((string *)this_00);
  path = this->http_client;
  headers = (Headers *)std::__cxx11::string::c_str();
  httplib::Client::Put
            ((Client *)local_a0,(char *)path,headers,(string *)&this->headers,(char *)this_00);
  peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_a0);
  if (peVar1 != (element_type *)0x0) {
    peVar2 = std::__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<httplib::Response,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a0);
    if (peVar2->status == 0xc9) goto LAB_0021cc38;
  }
  peVar1 = std::__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2> *)local_a0);
  throw_response_error(this,peVar1);
LAB_0021cc38:
  std::shared_ptr<httplib::Response>::~shared_ptr((shared_ptr<httplib::Response> *)local_a0);
  std::__cxx11::string::~string
            ((string *)
             &r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void YdiskRestClient::makeFolder(std::string utf8Path)
{
    std::string url("/v1/disk/resources?path=");
    url += url_encode(utf8Path);
    std::string empty_body;
    auto r = http_client->Put(url.c_str(), headers, empty_body, "text/plain");

    if(!r.get() || r->status!=201)
        throw_response_error(r.get());
}